

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

void Abc_NtkDetectClassesTest2(Abc_Ntk_t *pNtk,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  Vec_Wec_t *__ptr;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Vec_Wec_t *vCos;
  Vec_Wec_t *local_38;
  
  iVar1 = pNtk->vCis->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(pVVar4,*(int *)((long)pVVar6->pArray[lVar8] + 0x10));
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar8 < pVVar6->nSize);
  }
  __ptr = Abc_NtkDetectObjClasses(pNtk,pVVar4,&local_38);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    pVVar2 = __ptr->pArray;
    uVar10 = 0;
    do {
      printf(" %4d : {",uVar10 & 0xffffffff);
      if (0 < pVVar2[uVar10].nSize) {
        lVar8 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar2[uVar10].pArray[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar2[uVar10].nSize);
      }
      puts(" }");
      uVar10 = uVar10 + 1;
    } while (uVar10 != (long)iVar1);
  }
  if (0 < local_38->nSize) {
    uVar10 = 0;
    do {
      pVVar2 = local_38->pArray;
      printf(" %4d : {",uVar10 & 0xffffffff);
      if (0 < pVVar2[uVar10].nSize) {
        lVar8 = 0;
        do {
          printf(" %d",(ulong)(uint)pVVar2[uVar10].pArray[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar2[uVar10].nSize);
      }
      puts(" }");
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)local_38->nSize);
  }
  if (pVVar4->pArray != (int *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (int *)0x0;
  }
  free(pVVar4);
  iVar1 = __ptr->nCap;
  if (0 < (long)iVar1) {
    pVVar4 = __ptr->pArray;
    lVar8 = 0;
    do {
      pvVar3 = *(void **)((long)&pVVar4->pArray + lVar8);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&pVVar4->pArray + lVar8) = 0;
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar8);
  }
  if (__ptr->pArray != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (Vec_Int_t *)0x0;
  }
  __ptr->nCap = 0;
  __ptr->nSize = 0;
  free(__ptr);
  if (0 < local_38->nCap) {
    lVar8 = 8;
    lVar9 = 0;
    do {
      pvVar3 = *(void **)((long)&local_38->pArray->nCap + lVar8);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
        *(undefined8 *)((long)&local_38->pArray->nCap + lVar8) = 0;
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar9 < local_38->nCap);
  }
  if (local_38->pArray != (Vec_Int_t *)0x0) {
    free(local_38->pArray);
    local_38->pArray = (Vec_Int_t *)0x0;
  }
  local_38->nCap = 0;
  local_38->nSize = 0;
  free(local_38);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest2( Abc_Ntk_t * pNtk, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vObjs;
    Vec_Wec_t * vRes, * vCos;
    // for testing, create the set of object IDs for all combinational inputs (CIs)
    Abc_Obj_t * pObj; int i;
    vObjs = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vObjs, Abc_ObjId(pObj) );
    // compute equivalence classes of CIs and print them
    vRes = Abc_NtkDetectObjClasses( pNtk, vObjs, &vCos );
    Vec_WecPrint( vRes, 0 );
    Vec_WecPrint( vCos, 0 );
    // clean up
    Vec_IntFree( vObjs );
    Vec_WecFree( vRes );
    Vec_WecFree( vCos );
}